

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O0

Msat_MmStep_t * Msat_MmStepStart(int nSteps)

{
  Msat_MmStep_t *pMVar1;
  Msat_MmFixed_t **ppMVar2;
  Msat_MmFixed_t *pMVar3;
  int local_20;
  int local_1c;
  int k;
  int i;
  Msat_MmStep_t *p;
  int nSteps_local;
  
  pMVar1 = (Msat_MmStep_t *)malloc(0x20);
  pMVar1->nMems = nSteps;
  ppMVar2 = (Msat_MmFixed_t **)malloc((long)pMVar1->nMems << 3);
  pMVar1->pMems = ppMVar2;
  for (local_1c = 0; local_1c < pMVar1->nMems; local_1c = local_1c + 1) {
    pMVar3 = Msat_MmFixedStart(8 << ((byte)local_1c & 0x1f));
    pMVar1->pMems[local_1c] = pMVar3;
  }
  pMVar1->nMapSize = 4 << ((byte)pMVar1->nMems & 0x1f);
  ppMVar2 = (Msat_MmFixed_t **)malloc((long)(pMVar1->nMapSize + 1) << 3);
  pMVar1->pMap = ppMVar2;
  *pMVar1->pMap = (Msat_MmFixed_t *)0x0;
  for (local_20 = 1; local_20 < 5; local_20 = local_20 + 1) {
    pMVar1->pMap[local_20] = *pMVar1->pMems;
  }
  for (local_1c = 0; local_1c < pMVar1->nMems; local_1c = local_1c + 1) {
    local_20 = 4 << ((byte)local_1c & 0x1f);
    while (local_20 = local_20 + 1, local_20 <= 8 << ((byte)local_1c & 0x1f)) {
      pMVar1->pMap[local_20] = pMVar1->pMems[local_1c];
    }
  }
  return pMVar1;
}

Assistant:

Msat_MmStep_t * Msat_MmStepStart( int nSteps )
{
    Msat_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Msat_MmStep_t, 1 );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Msat_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Msat_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Msat_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}